

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  Scripting *scripting;
  ReportWriter *this;
  AnnotationResolver *annotations_00;
  Trace *pTVar2;
  uint uVar3;
  ulong uVar4;
  unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> report_writer;
  Profile profile_1;
  RomAccessor rom_accessor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy;
  AnnotationResolver annotations;
  Options options;
  Trace trace;
  
  snestistics::initLookupTables();
  options.rom_file._M_dataplus._M_p = (pointer)&options.rom_file.field_2;
  options.rom_file._M_string_length = 0;
  options.rom_file.field_2._M_local_buf[0] = '\0';
  options.rom_size = 0;
  options.trace_log_out_file._M_dataplus._M_p = (pointer)&options.trace_log_out_file.field_2;
  options.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.nmi_first = 0;
  options.nmi_last = 0;
  options.trace_log_out_file._M_string_length = 0;
  options.trace_log_out_file.field_2._M_local_buf[0] = '\0';
  options.script_file._M_dataplus._M_p = (pointer)&options.script_file.field_2;
  options.script_file._M_string_length = 0;
  options.script_file.field_2._M_local_buf[0] = '\0';
  options.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.auto_labels_file._M_dataplus._M_p = (pointer)&options.auto_labels_file.field_2;
  options.auto_labels_file._M_string_length = 0;
  options.auto_labels_file.field_2._M_local_buf[0] = '\0';
  options.auto_annotate = false;
  options.symbol_fma_out_file._M_dataplus._M_p = (pointer)&options.symbol_fma_out_file.field_2;
  options.symbol_fma_out_file._M_string_length = 0;
  options.symbol_fma_out_file.field_2._M_local_buf[0] = '\0';
  options.symbol_mesen_s_out_file._M_dataplus._M_p =
       (pointer)&options.symbol_mesen_s_out_file.field_2;
  options.symbol_mesen_s_out_file._M_string_length = 0;
  options.symbol_mesen_s_out_file.field_2._M_local_buf[0] = '\0';
  options.rewind_out_file._M_dataplus._M_p = (pointer)&options.rewind_out_file.field_2;
  options.rewind_out_file._M_string_length = 0;
  options.rewind_out_file.field_2._M_local_buf[0] = '\0';
  options.report_out_file._M_dataplus._M_p = (pointer)&options.report_out_file.field_2;
  options.report_out_file._M_string_length = 0;
  options.report_out_file.field_2._M_local_buf[0] = '\0';
  options.asm_out_file._M_dataplus._M_p = (pointer)&options.asm_out_file.field_2;
  options.asm_out_file._M_string_length = 0;
  options.asm_out_file.field_2._M_local_buf[0] = '\0';
  options.asm_header_file._M_dataplus._M_p = (pointer)&options.asm_header_file.field_2;
  options.asm_header_file._M_string_length = 0;
  options.asm_header_file.field_2._M_local_buf[0] = '\0';
  options.asm_print_dp = true;
  options.asm_lower_case_op = true;
  options.asm_print_pc = true;
  options.asm_print_bytes = true;
  options.asm_print_register_sizes = true;
  options.asm_print_db = true;
  options.asm_correct_wla = false;
  options.predict = PRD_FUNCTIONS;
  parse_options(argc,argv,&options);
  printf("Loading ROM \'%s\'\n",options.rom_file._M_dataplus._M_p);
  rom_accessor._rom_offset = 0xffffffff;
  rom_accessor._calculated_size = options.rom_size;
  rom_accessor._rom_data._data = (uchar *)0x0;
  rom_accessor._rom_data._size = 0;
  snestistics::Profile::Profile((Profile *)&trace,"Load ROM data",false);
  snestistics::RomAccessor::load(&rom_accessor,&options.rom_file);
  snestistics::Profile::~Profile((Profile *)&trace);
  snestistics::Trace::Trace(&trace);
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)options.trace_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)options.trace_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    snestistics::Trace::Trace((Trace *)&annotations);
    pTVar2 = (Trace *)&annotations;
    if (uVar4 == 0) {
      pTVar2 = &trace;
    }
    bVar1 = snestistics::load_trace_cache
                      (options.trace_files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar4,pTVar2);
    if (!bVar1) {
      snestistics::Profile::Profile(&profile_1,"Create trace using emulation",false);
      snestistics::create_trace
                (options.trace_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4,&rom_accessor,pTVar2);
      snestistics::Profile::~Profile(&profile_1);
    }
    if (uVar3 != 0) {
      snestistics::merge_trace(&trace,(Trace *)&annotations);
    }
    snestistics::Trace::~Trace((Trace *)&annotations);
  }
  if ((options.auto_labels_file._M_string_length != 0) &&
     ((__stream = fopen(options.auto_labels_file._M_dataplus._M_p,"rb"), __stream == (FILE *)0x0 ||
      (fclose(__stream), options.auto_annotate == true)))) {
    snestistics::Profile::Profile(&profile_1,"Regenerating auto-labels",false);
    annotations._hint_for_adress._data = (int *)0x0;
    annotations._hint_for_adress._size = 0;
    annotations._annotations.
    super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    annotations._annotations.
    super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    annotations._annotations.
    super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    annotations._annotation_for_adress._data._0_4_ = 0;
    annotations._annotation_for_adress._4_8_ = 0;
    snestistics::AnnotationResolver::load(&annotations,&options.labels_files);
    snestistics::guess_range(&trace,&rom_accessor,&annotations,&options.auto_labels_file);
    snestistics::AnnotationResolver::~AnnotationResolver(&annotations);
    snestistics::Profile::~Profile(&profile_1);
  }
  annotations._hint_for_adress._data = (int *)0x0;
  annotations._hint_for_adress._size = 0;
  annotations._annotations.
  super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  annotations._annotations.
  super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  annotations._annotations.
  super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  annotations._hints.super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  annotations._annotation_for_adress._data._0_4_ = 0;
  annotations._annotation_for_adress._4_8_ = 0;
  snestistics::Profile::Profile(&profile_1,"Loading game annotations",false);
  snestistics::AnnotationResolver::add_mmio_annotations(&annotations);
  snestistics::AnnotationResolver::add_vector_annotations(&annotations,&rom_accessor);
  if (options.auto_labels_file._M_string_length == 0) {
    snestistics::AnnotationResolver::load(&annotations,&options.labels_files);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&copy,&options.labels_files);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&copy,&options.auto_labels_file);
    snestistics::AnnotationResolver::load(&annotations,&copy);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&copy);
  }
  snestistics::Profile::~Profile(&profile_1);
  if (options.symbol_fma_out_file._M_string_length != 0) {
    snestistics::symbol_export_fma(&annotations,&options.symbol_fma_out_file,false);
  }
  if (options.symbol_mesen_s_out_file._M_string_length != 0) {
    snestistics::symbol_export_mesen_s(&annotations,&options.symbol_mesen_s_out_file);
  }
  if (options.rewind_out_file._M_string_length != 0) {
    snestistics::rewind_report(&options,&rom_accessor,&annotations);
  }
  if (options.trace_log_out_file._M_string_length != 0) {
    snestistics::Profile::Profile(&profile_1,"Create trace log",false);
    if (options.script_file._M_string_length == 0) {
      scripting = (Scripting *)0x0;
    }
    else {
      scripting = scripting_interface::create_scripting(options.script_file._M_dataplus._M_p);
    }
    snestistics::write_trace_log(&options,&rom_accessor,&annotations,scripting);
    if (scripting != (Scripting *)0x0) {
      scripting_interface::destroy_scripting(scripting);
    }
    snestistics::Profile::~Profile(&profile_1);
  }
  report_writer._M_t.super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
  super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
  super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl =
       (__uniq_ptr_data<ReportWriter,_std::default_delete<ReportWriter>,_true,_true>)
       (__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)0x0;
  if (options.report_out_file._M_string_length != 0) {
    this = (ReportWriter *)operator_new(0x10);
    ReportWriter::ReportWriter(this,options.report_out_file._M_dataplus._M_p);
    std::__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>::reset
              ((__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_> *)&report_writer,
               this);
  }
  snestistics::predict
            (options.predict,
             (ReportWriter *)
             report_writer._M_t.
             super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
             super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
             super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl,&rom_accessor,&trace,
             &annotations);
  if (options.asm_out_file._M_string_length != 0) {
    snestistics::Profile::Profile(&profile_1,"Writing asm",false);
    ReportWriter::ReportWriter((ReportWriter *)&copy,options.asm_out_file._M_dataplus._M_p);
    snestistics::asm_writer((ReportWriter *)&copy,&options,&trace,&annotations,&rom_accessor);
    ReportWriter::~ReportWriter((ReportWriter *)&copy);
    snestistics::Profile::~Profile(&profile_1);
  }
  if ((__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)
      report_writer._M_t.super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>.
      _M_t.super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
      super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)0x0) {
    data_report((ReportWriter *)
                report_writer._M_t.
                super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
                super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
                super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl,&trace,&annotations,true,
                true);
    dma_report((ReportWriter *)
               report_writer._M_t.
               super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
               super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
               super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl,&trace,&annotations);
    pTVar2 = (Trace *)&rom_accessor;
    branch_report((ReportWriter *)
                  report_writer._M_t.
                  super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
                  super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
                  super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl,(RomAccessor *)pTVar2,
                  &trace,&annotations);
    entry_point_report((ReportWriter *)
                       report_writer._M_t.
                       super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
                       super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
                       super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl,pTVar2,
                       annotations_00);
  }
  std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::~unique_ptr(&report_writer);
  snestistics::AnnotationResolver::~AnnotationResolver(&annotations);
  snestistics::Trace::~Trace(&trace);
  snestistics::Array<unsigned_char>::~Array(&rom_accessor._rom_data);
  Options::~Options(&options);
  return 0;
}

Assistant:

int main(const int argc, const char * const argv[]) {
	try {
		initLookupTables();

		Options options;
		parse_options(argc, argv, options);

		printf("Loading ROM '%s'\n", options.rom_file.c_str());

		// TODO: TraceHeader has rom_size and rom_mode (lorom/hirom) so lets read them!
		RomAccessor rom_accessor(options.rom_size);
		{
			Profile profile("Load ROM data");
			rom_accessor.load(options.rom_file);
		}

		Trace trace;

		for (uint32_t k=0; k<options.trace_files.size(); ++k) {
			bool generate = true;

			Trace backing_trace;
			Trace &local_trace = k==0 ? trace : backing_trace;

			if (load_trace_cache(options.trace_files[k], local_trace))
				generate = false;

			if (generate) {
				Profile profile("Create trace using emulation");
				create_trace(options.trace_files[k], rom_accessor, local_trace); // Will automatically save new cache
			}

			if (k != 0) {
				merge_trace(trace, local_trace);
			}
		}

		if (!options.auto_labels_file.empty()) {
			FILE *test_file = fopen(options.auto_labels_file.c_str(), "rb");
			bool auto_file_exists = test_file != NULL;
			if (test_file != NULL) {
				fclose(test_file);
			}
			
			if (options.auto_annotate || !auto_file_exists) {
				Profile profile("Regenerating auto-labels");
				// We load annotations here since we want to avoid the annotation file
				AnnotationResolver annotations;
				annotations.load(options.labels_files);
				guess_range(trace, rom_accessor, annotations, options.auto_labels_file);
			}
		}

		AnnotationResolver annotations;
		{
			Profile profile("Loading game annotations");
			annotations.add_mmio_annotations();
			annotations.add_vector_annotations(rom_accessor);
			if (options.auto_labels_file.empty()) {
				// Don't load the auto-labels file if we are re-generating it
				annotations.load(options.labels_files);
			} else {
				std::vector<std::string> copy(options.labels_files);
				copy.push_back(options.auto_labels_file);
				annotations.load(copy);
			}
		}

		if (!options.symbol_fma_out_file.empty()) {
			symbol_export_fma(annotations, options.symbol_fma_out_file, false);
		}

		if (!options.symbol_mesen_s_out_file.empty()) {
			// false here is to disable multiline comments since bsnes-plus does not support them
			symbol_export_mesen_s(annotations, options.symbol_mesen_s_out_file);
		}

		// Make sure this happens after create_trace so skip file is fresh
		if (!options.rewind_out_file.empty()) {
			rewind_report(options, rom_accessor, annotations);
		}

		// Write trace log if requested
		if (!options.trace_log_out_file.empty()) {
			Profile profile("Create trace log");

			bool has_scripting = !options.script_file.empty();

			scripting_interface::Scripting *scripting = nullptr;
			
			if (!options.script_file.empty())
				scripting = scripting_interface::create_scripting(options.script_file.c_str());
			
			write_trace_log(options, rom_accessor, annotations, scripting);

			if (scripting)
				scripting_interface::destroy_scripting(scripting);
		}

		std::unique_ptr<ReportWriter> report_writer;
		if (!options.report_out_file.empty())
			report_writer.reset(new ReportWriter(options.report_out_file.c_str()));

		// TODO: Maybe run once before guess_range as well to find longer ranges
		predict(options.predict, report_writer.get(), rom_accessor, trace, annotations);

		if (!options.asm_out_file.empty()) {
			Profile profile("Writing asm");
			ReportWriter asm_output(options.asm_out_file.c_str());
			asm_writer(asm_output, options, trace, annotations, rom_accessor);
		}

		if (report_writer) {
			data_report(*report_writer, trace, annotations);
			dma_report(*report_writer, trace, annotations);
			branch_report(*report_writer, rom_accessor, trace, annotations);
			entry_point_report(*report_writer, trace, annotations);
		}

	} catch (const std::runtime_error &e) {
		printf("error: %s\n", e.what());
		return 1;
	} catch (const std::exception &e) {
		printf("error: %s\n", e.what());
		return 1;
	}

	return 0;
}